

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine.cpp
# Opt level: O0

void __thiscall QPaintEngine::QPaintEngine(QPaintEngine *this,PaintEngineFeatures caps)

{
  long lVar1;
  QPaintEnginePrivate *pQVar2;
  Int in_ESI;
  QPaintEngine *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->_vptr_QPaintEngine = (_func_int **)&PTR__QPaintEngine_00e1c358;
  in_RDI->state = (QPaintEngineState *)0x0;
  (in_RDI->gccaps).super_QFlagsStorageHelper<QPaintEngine::PaintEngineFeature,_4>.
  super_QFlagsStorage<QPaintEngine::PaintEngineFeature>.i = in_ESI;
  in_RDI->field_0x14 = in_RDI->field_0x14 & 0xfe;
  in_RDI->field_0x14 = in_RDI->field_0x14 & 0xfd;
  in_RDI->field_0x14 = in_RDI->field_0x14 & 0xfb;
  pQVar2 = (QPaintEnginePrivate *)operator_new(0xa0);
  QPaintEnginePrivate::QPaintEnginePrivate(pQVar2);
  QScopedPointer<QPaintEnginePrivate,_QScopedPointerDeleter<QPaintEnginePrivate>_>::QScopedPointer
            (&in_RDI->d_ptr,pQVar2);
  pQVar2 = QScopedPointer<QPaintEnginePrivate,_QScopedPointerDeleter<QPaintEnginePrivate>_>::
           operator->(&in_RDI->d_ptr);
  pQVar2->q_ptr = in_RDI;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QPaintEngine::QPaintEngine(PaintEngineFeatures caps)
    : state(nullptr),
      gccaps(caps),
      active(0),
      selfDestruct(false),
      extended(false),
      d_ptr(new QPaintEnginePrivate)
{
    d_ptr->q_ptr = this;
}